

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall cfd::TransactionContext::TransactionContext(TransactionContext *this)

{
  Transaction *in_RDI;
  
  core::Transaction::Transaction(in_RDI);
  (in_RDI->super_AbstractTransaction)._vptr_AbstractTransaction =
       (_func_int **)&PTR__TransactionContext_009f7670;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x50b854);
  std::
  map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
  ::map((map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
         *)0x50b862);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x50b873);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::vector
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x50b884);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::clear
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x50b892);
  std::
  map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
  ::clear((map<cfd::core::OutPoint,_cfd::core::SigHashType,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
           *)0x50b8a0);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::clear
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x50b8b1);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::clear
            ((vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *)0x50b8c2);
  return;
}

Assistant:

TransactionContext::TransactionContext() {
  utxo_map_.clear();
  signed_map_.clear();
  verify_map_.clear();
  verify_ignore_map_.clear();
}